

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconsStamp.cpp
# Opt level: O2

void __thiscall OpenMD::ZConsStamp::ZConsStamp(ZConsStamp *this)

{
  ParamMap *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  allocator<char> local_89;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  size_type local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  local_68;
  ParameterBase *local_40;
  ParameterBase *local_38;
  
  DataHolder::DataHolder(&this->super_DataHolder);
  (this->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__ZConsStamp_002bfbd8;
  (this->MolIndex).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->MolIndex).super_ParameterBase.keyword_.field_2;
  (this->MolIndex).super_ParameterBase.keyword_._M_string_length = 0;
  local_38 = &(this->MolIndex).super_ParameterBase;
  (this->MolIndex).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->MolIndex).super_ParameterBase.optional_ = false;
  (this->MolIndex).super_ParameterBase.defaultValue_ = false;
  (this->MolIndex).super_ParameterBase.empty_ = true;
  (this->MolIndex).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bccd0;
  (this->Zpos).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->Zpos).super_ParameterBase.keyword_.field_2;
  (this->Zpos).super_ParameterBase.keyword_._M_string_length = 0;
  (this->Zpos).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->Zpos).super_ParameterBase.optional_ = false;
  (this->Zpos).super_ParameterBase.defaultValue_ = false;
  (this->Zpos).super_ParameterBase.empty_ = true;
  (this->Zpos).super_ParameterBase._vptr_ParameterBase = (_func_int **)&PTR__ParameterBase_002bcc58;
  (this->Kratio).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->Kratio).super_ParameterBase.keyword_.field_2;
  (this->Kratio).super_ParameterBase.keyword_._M_string_length = 0;
  (this->Kratio).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->Kratio).super_ParameterBase.optional_ = false;
  (this->Kratio).super_ParameterBase.defaultValue_ = false;
  local_40 = &(this->Zpos).super_ParameterBase;
  (this->Kratio).super_ParameterBase.empty_ = true;
  (this->Kratio).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bcc58;
  (this->CantVel).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->CantVel).super_ParameterBase.keyword_.field_2;
  (this->CantVel).super_ParameterBase.keyword_._M_string_length = 0;
  (this->CantVel).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->CantVel).super_ParameterBase.optional_ = false;
  (this->CantVel).super_ParameterBase.defaultValue_ = false;
  (this->CantVel).super_ParameterBase.empty_ = true;
  (this->CantVel).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bcc58;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"molIndex",(allocator<char> *)&local_88);
  std::__cxx11::string::_M_assign((string *)&(this->MolIndex).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"molIndex",&local_89);
  local_68.first._M_string_length = local_80;
  this_00 = &(this->super_DataHolder).parameters_;
  paVar1 = &local_68.first.field_2;
  if (local_88 == &local_78) {
    local_68.first.field_2._8_8_ = local_78._8_8_;
    local_68.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_68.first._M_dataplus._M_p = (pointer)local_88;
  }
  local_80 = 0;
  local_78._M_local_buf[0] = '\0';
  local_68.second = local_38;
  local_88 = &local_78;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"zPos",(allocator<char> *)&local_88);
  std::__cxx11::string::_M_assign((string *)&(this->Zpos).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_68);
  (this->Zpos).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"zPos",&local_89);
  local_68.first._M_string_length = local_80;
  if (local_88 == &local_78) {
    local_68.first.field_2._8_8_ = local_78._8_8_;
    local_68.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_68.first._M_dataplus._M_p = (pointer)local_88;
  }
  local_68.first.field_2._M_allocated_capacity._1_7_ = local_78._M_allocated_capacity._1_7_;
  local_68.first.field_2._M_local_buf[0] = local_78._M_local_buf[0];
  local_80 = 0;
  local_78._M_local_buf[0] = '\0';
  local_68.second = local_40;
  local_88 = &local_78;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"kRatio",(allocator<char> *)&local_88);
  std::__cxx11::string::_M_assign((string *)&(this->Kratio).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_68);
  (this->Kratio).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"kRatio",&local_89);
  local_68.first._M_string_length = local_80;
  if (local_88 == &local_78) {
    local_68.first.field_2._8_8_ = local_78._8_8_;
    local_68.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_68.first._M_dataplus._M_p = (pointer)local_88;
  }
  local_68.first.field_2._M_allocated_capacity._1_7_ = local_78._M_allocated_capacity._1_7_;
  local_68.first.field_2._M_local_buf[0] = local_78._M_local_buf[0];
  local_80 = 0;
  local_78._M_local_buf[0] = '\0';
  local_88 = &local_78;
  local_68.second = &(this->Kratio).super_ParameterBase;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"cantVel",(allocator<char> *)&local_88);
  std::__cxx11::string::_M_assign((string *)&(this->CantVel).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_68);
  (this->CantVel).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"cantVel",&local_89);
  local_68.first._M_string_length = local_80;
  if (local_88 == &local_78) {
    local_68.first.field_2._8_8_ = local_78._8_8_;
    local_68.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_68.first._M_dataplus._M_p = (pointer)local_88;
  }
  local_68.first.field_2._M_allocated_capacity._1_7_ = local_78._M_allocated_capacity._1_7_;
  local_68.first.field_2._M_local_buf[0] = local_78._M_local_buf[0];
  local_80 = 0;
  local_78._M_local_buf[0] = '\0';
  local_88 = &local_78;
  local_68.second = &(this->CantVel).super_ParameterBase;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  return;
}

Assistant:

ZConsStamp::ZConsStamp() {
    DefineParameter(MolIndex, "molIndex");
    DefineOptionalParameter(Zpos, "zPos");
    DefineOptionalParameter(Kratio, "kRatio");
    DefineOptionalParameter(CantVel, "cantVel");
  }